

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileTimeComparison.cxx
# Opt level: O3

bool __thiscall
cmFileTimeComparison::FileTimeCompare(cmFileTimeComparison *this,char *f1,char *f2,int *result)

{
  cmFileTimeComparisonInternal *this_00;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  stat s2;
  stat s1;
  stat sStack_138;
  stat local_a8;
  
  this_00 = this->Internals;
  bVar1 = cmFileTimeComparisonInternal::Stat(this_00,f1,&local_a8);
  uVar3 = 0;
  bVar2 = false;
  if (bVar1) {
    bVar1 = cmFileTimeComparisonInternal::Stat(this_00,f2,&sStack_138);
    uVar3 = 0;
    bVar2 = false;
    if (bVar1) {
      bVar2 = true;
      uVar3 = 0xffffffff;
      if (sStack_138.st_mtim.tv_sec <= local_a8.st_mtim.tv_sec) {
        if (sStack_138.st_mtim.tv_sec < local_a8.st_mtim.tv_sec) {
          uVar3 = 1;
        }
        else if (sStack_138.st_mtim.tv_nsec <= local_a8.st_mtim.tv_nsec) {
          uVar3 = (uint)(sStack_138.st_mtim.tv_nsec < local_a8.st_mtim.tv_nsec);
        }
      }
    }
  }
  *result = uVar3;
  return bVar2;
}

Assistant:

bool cmFileTimeComparison::FileTimeCompare(const char* f1,
                                           const char* f2, int* result)
{
  return this->Internals->FileTimeCompare(f1, f2, result);
}